

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

bool __thiscall lunasvg::Length::parse(Length *this,string_view input,LengthNegativeMode mode)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  LengthUnits LVar4;
  long lVar5;
  size_t sVar6;
  byte *pbVar7;
  long lVar8;
  float value;
  string_view local_28;
  float local_14;
  
  pbVar7 = (byte *)input._M_str;
  local_28._M_len = input._M_len;
  local_14 = 0.0;
  local_28._M_str = (char *)pbVar7;
  if (local_28._M_len != 0) {
    pbVar1 = pbVar7 + local_28._M_len;
    lVar5 = -local_28._M_len;
    do {
      if ((0x20 < (ulong)(byte)*local_28._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_28._M_str & 0x3f) & 1) == 0)) {
        lVar8 = 0;
        goto LAB_0011f39a;
      }
      local_28._M_str = (char *)((byte *)local_28._M_str + 1);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
    local_28._M_len = 0;
    local_28._M_str = (char *)pbVar1;
  }
  goto LAB_0011f3c2;
  while (bVar3 = lVar5 + 1 != lVar8, lVar8 = lVar8 + -1, bVar3) {
LAB_0011f39a:
    if ((0x20 < (ulong)pbVar7[lVar8 + (local_28._M_len - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar7[lVar8 + (local_28._M_len - 1)] & 0x3f) & 1) == 0)) {
      local_28._M_len = lVar8 - lVar5;
      goto LAB_0011f3c2;
    }
  }
  local_28._M_len = 0;
LAB_0011f3c2:
  bVar3 = parseNumber<float>(&local_28,&local_14);
  if (!bVar3) {
    return false;
  }
  if ((mode == Forbid) && (local_14 < 0.0)) {
    return false;
  }
  if (local_28._M_len == 0) {
    this->m_value = local_14;
    this->m_units = None;
    return true;
  }
  bVar2 = *local_28._M_str;
  if (bVar2 < 0x69) {
    if (bVar2 == 0x25) {
      this->m_value = local_14;
      this->m_units = Percent;
      sVar6 = 1;
      goto LAB_0011f587;
    }
    if (bVar2 == 99) {
      if (local_28._M_len == 1) {
        return false;
      }
      if (local_28._M_str[1] != 0x6d) {
        return false;
      }
      local_14 = (local_14 * 96.0) / 2.54;
      goto LAB_0011f57a;
    }
    if (bVar2 != 0x65) {
      return false;
    }
    if (local_28._M_len == 1) {
      return false;
    }
    if (local_28._M_str[1] == 0x6d) {
      LVar4 = Em;
    }
    else {
      if (local_28._M_str[1] != 0x78) {
        return false;
      }
      LVar4 = Ex;
    }
    this->m_units = LVar4;
    this->m_value = local_14;
  }
  else {
    if (bVar2 == 0x69) {
      if (local_28._M_len == 1) {
        return false;
      }
      if (local_28._M_str[1] != 0x6e) {
        return false;
      }
      local_14 = local_14 * 96.0;
    }
    else if (bVar2 == 0x6d) {
      if (local_28._M_len == 1) {
        return false;
      }
      if (local_28._M_str[1] != 0x6d) {
        return false;
      }
      local_14 = (local_14 * 96.0) / 25.4;
    }
    else {
      if (bVar2 != 0x70) {
        return false;
      }
      if (local_28._M_len == 1) {
        return false;
      }
      bVar2 = local_28._M_str[1];
      if (bVar2 != 0x78) {
        if (bVar2 == 0x74) {
          local_14 = (local_14 * 96.0) / 72.0;
        }
        else {
          if (bVar2 != 99) {
            return false;
          }
          local_14 = (local_14 * 96.0) / 6.0;
        }
      }
    }
LAB_0011f57a:
    this->m_value = local_14;
    this->m_units = Px;
  }
  sVar6 = 2;
LAB_0011f587:
  return local_28._M_len == sVar6;
}

Assistant:

bool Length::parse(std::string_view input, LengthNegativeMode mode)
{
    float value = 0.f;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value))
        return false;
    if(value < 0.f && mode == LengthNegativeMode::Forbid)
        return false;
    if(input.empty()) {
        m_value = value;
        m_units = LengthUnits::None;
        return true;
    }

    constexpr auto dpi = 96.f;
    switch(input.front()) {
    case '%':
        m_value = value;
        m_units = LengthUnits::Percent;
        input.remove_prefix(1);
        break;
    case 'p':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'x')
            m_value = value;
        else if(input.front() == 'c')
            m_value = value * dpi / 6.f;
        else if(input.front() == 't')
            m_value = value * dpi / 72.f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'i':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'n')
            m_value = value * dpi;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'c':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 2.54f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'm':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_value = value * dpi / 25.4f;
        else
            return false;
        m_units = LengthUnits::Px;
        input.remove_prefix(1);
        break;
    case 'e':
        input.remove_prefix(1);
        if(input.empty())
            return false;
        else if(input.front() == 'm')
            m_units = LengthUnits::Em;
        else if(input.front() == 'x')
            m_units = LengthUnits::Ex;
        else
            return false;
        m_value = value;
        input.remove_prefix(1);
        break;
    default:
        return false;
    }

    return input.empty();
}